

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O1

double __thiscall tfs::TMatrix<double>::sum(TMatrix<double> *this)

{
  double *pdVar1;
  double dVar2;
  
  pdVar1 = this->m_data;
  if ((((pdVar1 == (double *)0x0) || (this->m_end <= pdVar1)) || (this->m_count == 0)) ||
     (this->m_length == 0)) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"sum",0x189,"empty matrix");
    dVar2 = 0.0;
  }
  else {
    dVar2 = *pdVar1;
    while (pdVar1 = pdVar1 + 1, pdVar1 < this->m_end) {
      dVar2 = dVar2 + *pdVar1;
    }
  }
  return dVar2;
}

Assistant:

inline T sum( void ) const {                    // Return sum of matrix elements.
            if( isEmpty()) {
                log_error( "empty matrix" );
                return 0;
            }
            const T *      data = m_data;
            const T * const end = m_end;
            
            T result = *data++;
            while( data < end ) {
                result += *data++;
            }
            return result;
        }